

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSSingleFromBMPWithOffsets(UConverterFromUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  UChar UVar1;
  uint uVar2;
  uint16_t *puVar3;
  UBool UVar4;
  UChar *pUVar5;
  long local_90;
  size_t count_1;
  int32_t count;
  UChar trail;
  uint16_t minValue;
  uint16_t value;
  uint32_t asciiRoundtrips;
  int32_t sourceIndex;
  UChar32 c;
  uint16_t *results;
  uint16_t *table;
  int32_t *offsets;
  int32_t length;
  int32_t targetCapacity;
  uint8_t *target;
  UChar *lastSource;
  UChar *sourceLimit;
  UChar *source;
  UConverter *cnv;
  UErrorCode *pErrorCode_local;
  UConverterFromUnicodeArgs *pArgs_local;
  
  source = (UChar *)pArgs->converter;
  target = (uint8_t *)pArgs->source;
  lastSource = pArgs->sourceLimit;
  _length = (uint8_t *)pArgs->target;
  offsets._4_4_ = (int)pArgs->targetLimit - (int)pArgs->target;
  table = (uint16_t *)pArgs->offsets;
  puVar3 = (((UConverter *)source)->sharedData->mbcs).fromUnicodeTable;
  if ((((UConverter *)source)->options & 0x10) == 0) {
    _sourceIndex = (((UConverter *)source)->sharedData->mbcs).fromUnicodeBytes;
  }
  else {
    _sourceIndex = (((UConverter *)source)->sharedData->mbcs).swapLFNLFromUnicodeBytes;
  }
  uVar2 = (((UConverter *)source)->sharedData->mbcs).asciiRoundtrips;
  if (((UConverter *)source)->useFallback == '\0') {
    count._0_2_ = 0xc00;
  }
  else {
    count._0_2_ = 0x800;
  }
  asciiRoundtrips = ((UConverter *)source)->fromUChar32;
  _minValue = -1;
  if (asciiRoundtrips == 0) {
    _minValue = 0;
  }
  offsets._0_4_ = (int)((long)lastSource - (long)target >> 1);
  if ((int)offsets < offsets._4_4_) {
    offsets._4_4_ = (int)offsets;
  }
  sourceLimit = (UChar *)target;
  cnv = (UConverter *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pArgs;
  if (asciiRoundtrips == 0) goto LAB_00390ecf;
  if (offsets._4_4_ < 1) goto LAB_00390ecf;
  while( true ) {
    if (lastSource <= sourceLimit) {
      if (*(byte *)((long)pErrorCode_local + 2) != 0) {
        *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xb;
      }
      goto LAB_0039118c;
    }
    if ((*sourceLimit & 0xfc00U) != 0xdc00) break;
    asciiRoundtrips = asciiRoundtrips * 0x400 + (uint)(ushort)*sourceLimit + 0xfca02400;
    sourceLimit = sourceLimit + 1;
    do {
      offsets._0_4_ = 2;
      if (asciiRoundtrips < 0x10000) {
        offsets._0_4_ = 1;
      }
      if (table != (uint16_t *)0x0) {
        for (count_1._0_4_ = (int)((long)sourceLimit - (long)target >> 1) - (int)offsets;
            0 < (int)count_1; count_1._0_4_ = (int)count_1 + -1) {
          *(int *)table = _minValue;
          _minValue = _minValue + 1;
          table = table + 2;
        }
      }
      target = (uint8_t *)sourceLimit;
      asciiRoundtrips =
           _extFromU((UConverter *)source,*(UConverterSharedData **)(source + 0x18),asciiRoundtrips,
                     &sourceLimit,lastSource,(uint8_t **)&length,
                     *(uint8_t **)(pErrorCode_local + 10),(int32_t **)&table,_minValue,
                     *(byte *)((long)pErrorCode_local + 2),(UErrorCode *)cnv);
      _minValue = (int)offsets + (int)((long)sourceLimit - (long)target >> 1) + _minValue;
      target = (uint8_t *)sourceLimit;
      UVar4 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
      if (UVar4 != '\0') goto LAB_0039118c;
      offsets._4_4_ = (int)*(undefined8 *)(pErrorCode_local + 10) - (int)_length;
      offsets._0_4_ = (int)((long)lastSource - (long)sourceLimit >> 1);
      if ((int)offsets < offsets._4_4_) {
        offsets._4_4_ = (int)offsets;
      }
LAB_00390ecf:
      while( true ) {
        while( true ) {
          if (offsets._4_4_ < 1) goto LAB_0039118c;
          pUVar5 = sourceLimit + 1;
          UVar1 = *sourceLimit;
          asciiRoundtrips = (uint32_t)(ushort)UVar1;
          sourceLimit = pUVar5;
          if ((0x7f < asciiRoundtrips) ||
             ((uVar2 & 1 << ((byte)((int)asciiRoundtrips >> 2) & 0x1f)) == 0)) break;
          *_length = (uint8_t)UVar1;
          offsets._4_4_ = offsets._4_4_ + -1;
          asciiRoundtrips = 0;
          _length = _length + 1;
        }
        if (*(ushort *)
             (_sourceIndex +
             (long)(int)((uint)puVar3[(int)((uint)puVar3[(int)asciiRoundtrips >> 10] +
                                           ((int)asciiRoundtrips >> 4 & 0x3fU))] +
                        (asciiRoundtrips & 0xf)) * 2) < (ushort)count) break;
        *_length = (uint8_t)*(ushort *)
                             (_sourceIndex +
                             (long)(int)((uint)puVar3[(int)((uint)puVar3[(int)asciiRoundtrips >> 10]
                                                           + ((int)asciiRoundtrips >> 4 & 0x3fU))] +
                                        (asciiRoundtrips & 0xf)) * 2);
        offsets._4_4_ = offsets._4_4_ + -1;
        asciiRoundtrips = 0;
        _length = _length + 1;
      }
    } while ((asciiRoundtrips & 0xfffff800) != 0xd800);
    if ((UVar1 & 0x400U) != 0) {
      *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
LAB_0039118c:
      UVar4 = U_SUCCESS(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
      if (((UVar4 != '\0') && (sourceLimit < lastSource)) &&
         (*(uint8_t **)(pErrorCode_local + 10) <= _length)) {
        *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
      }
      if (table != (uint16_t *)0x0) {
        local_90 = (long)sourceLimit - (long)target >> 1;
        if ((local_90 != 0) && (*(int *)&cnv->fromUCharErrorBehaviour == 0xb)) {
          local_90 = local_90 + -1;
        }
        for (; local_90 != 0; local_90 = local_90 + -1) {
          *(int *)table = _minValue;
          _minValue = _minValue + 1;
          table = table + 2;
        }
      }
      *(uint32_t *)(source + 0x2a) = asciiRoundtrips;
      *(UChar **)(pErrorCode_local + 4) = sourceLimit;
      *(uint8_t **)(pErrorCode_local + 8) = _length;
      *(uint16_t **)(pErrorCode_local + 0xc) = table;
      return;
    }
  }
  *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
  goto LAB_0039118c;
}

Assistant:

static void
ucnv_MBCSSingleFromBMPWithOffsets(UConverterFromUnicodeArgs *pArgs,
                              UErrorCode *pErrorCode) {
    UConverter *cnv;
    const UChar *source, *sourceLimit, *lastSource;
    uint8_t *target;
    int32_t targetCapacity, length;
    int32_t *offsets;

    const uint16_t *table;
    const uint16_t *results;

    UChar32 c;

    int32_t sourceIndex;

    uint32_t asciiRoundtrips;
    uint16_t value, minValue;

    /* set up the local pointers */
    cnv=pArgs->converter;
    source=pArgs->source;
    sourceLimit=pArgs->sourceLimit;
    target=(uint8_t *)pArgs->target;
    targetCapacity=(int32_t)(pArgs->targetLimit-pArgs->target);
    offsets=pArgs->offsets;

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    if(cnv->useFallback) {
        /* use all roundtrip and fallback results */
        minValue=0x800;
    } else {
        /* use only roundtrips and fallbacks from private-use characters */
        minValue=0xc00;
    }

    /* get the converter state from UConverter */
    c=cnv->fromUChar32;

    /* sourceIndex=-1 if the current character began in the previous buffer */
    sourceIndex= c==0 ? 0 : -1;
    lastSource=source;

    /*
     * since the conversion here is 1:1 UChar:uint8_t, we need only one counter
     * for the minimum of the sourceLength and targetCapacity
     */
    length=(int32_t)(sourceLimit-source);
    if(length<targetCapacity) {
        targetCapacity=length;
    }

    /* conversion loop */
    if(c!=0 && targetCapacity>0) {
        goto getTrail;
    }

#if MBCS_UNROLL_SINGLE_FROM_BMP
    /* unrolling makes it slower on Pentium III/Windows 2000?! */
    /* unroll the loop with the most common case */
unrolled:
    if(targetCapacity>=4) {
        int32_t count, loops;
        uint16_t andedValues;

        loops=count=targetCapacity>>2;
        do {
            c=*source++;
            andedValues=value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
            *target++=(uint8_t)value;
            c=*source++;
            andedValues&=value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
            *target++=(uint8_t)value;
            c=*source++;
            andedValues&=value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
            *target++=(uint8_t)value;
            c=*source++;
            andedValues&=value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
            *target++=(uint8_t)value;

            /* were all 4 entries really valid? */
            if(andedValues<minValue) {
                /* no, return to the first of these 4 */
                source-=4;
                target-=4;
                break;
            }
        } while(--count>0);
        count=loops-count;
        targetCapacity-=4*count;

        if(offsets!=NULL) {
            lastSource+=4*count;
            while(count>0) {
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                --count;
            }
        }

        c=0;
    }
#endif

    while(targetCapacity>0) {
        /*
         * Get a correct Unicode code point:
         * a single UChar for a BMP code point or
         * a matched surrogate pair for a "supplementary code point".
         */
        c=*source++;
        /*
         * Do not immediately check for single surrogates:
         * Assume that they are unassigned and check for them in that case.
         * This speeds up the conversion of assigned characters.
         */
        /* convert the Unicode code point in c into codepage bytes */
        if(c<=0x7f && IS_ASCII_ROUNDTRIP(c, asciiRoundtrips)) {
            *target++=(uint8_t)c;
            --targetCapacity;
            c=0;
            continue;
        }
        value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
        /* is this code point assigned, or do we use fallbacks? */
        if(value>=minValue) {
            /* assigned, write the output character bytes from value and length */
            /* length==1 */
            /* this is easy because we know that there is enough space */
            *target++=(uint8_t)value;
            --targetCapacity;

            /* normal end of conversion: prepare for a new character */
            c=0;
            continue;
        } else if(!U16_IS_SURROGATE(c)) {
            /* normal, unassigned BMP character */
        } else if(U16_IS_SURROGATE_LEAD(c)) {
getTrail:
            if(source<sourceLimit) {
                /* test the following code unit */
                UChar trail=*source;
                if(U16_IS_TRAIL(trail)) {
                    ++source;
                    c=U16_GET_SUPPLEMENTARY(c, trail);
                    /* this codepage does not map supplementary code points */
                    /* callback(unassigned) */
                } else {
                    /* this is an unmatched lead code unit (1st surrogate) */
                    /* callback(illegal) */
                    *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                    break;
                }
            } else {
                /* no more input */
                if (pArgs->flush) {
                    *pErrorCode=U_TRUNCATED_CHAR_FOUND;
                }
                break;
            }
        } else {
            /* this is an unmatched trail code unit (2nd surrogate) */
            /* callback(illegal) */
            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            break;
        }

        /* c does not have a mapping */

        /* get the number of code units for c to correctly advance sourceIndex */
        length=U16_LENGTH(c);

        /* set offsets since the start or the last extension */
        if(offsets!=NULL) {
            int32_t count=(int32_t)(source-lastSource);

            /* do not set the offset for this character */
            count-=length;

            while(count>0) {
                *offsets++=sourceIndex++;
                --count;
            }
            /* offsets and sourceIndex are now set for the current character */
        }

        /* try an extension mapping */
        lastSource=source;
        c=_extFromU(cnv, cnv->sharedData,
                    c, &source, sourceLimit,
                    &target, (const uint8_t *)(pArgs->targetLimit),
                    &offsets, sourceIndex,
                    pArgs->flush,
                    pErrorCode);
        sourceIndex+=length+(int32_t)(source-lastSource);
        lastSource=source;

        if(U_FAILURE(*pErrorCode)) {
            /* not mappable or buffer overflow */
            break;
        } else {
            /* a mapping was written to the target, continue */

            /* recalculate the targetCapacity after an extension mapping */
            targetCapacity=(int32_t)(pArgs->targetLimit-(char *)target);
            length=(int32_t)(sourceLimit-source);
            if(length<targetCapacity) {
                targetCapacity=length;
            }
        }

#if MBCS_UNROLL_SINGLE_FROM_BMP
        /* unrolling makes it slower on Pentium III/Windows 2000?! */
        goto unrolled;
#endif
    }

    if(U_SUCCESS(*pErrorCode) && source<sourceLimit && target>=(uint8_t *)pArgs->targetLimit) {
        /* target is full */
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }

    /* set offsets since the start or the last callback */
    if(offsets!=NULL) {
        size_t count=source-lastSource;
        if (count > 0 && *pErrorCode == U_TRUNCATED_CHAR_FOUND) {
            /*
            Caller gave us a partial supplementary character,
            which this function couldn't convert in any case.
            The callback will handle the offset.
            */
            count--;
        }
        while(count>0) {
            *offsets++=sourceIndex++;
            --count;
        }
    }

    /* set the converter state back into UConverter */
    cnv->fromUChar32=c;

    /* write back the updated pointers */
    pArgs->source=source;
    pArgs->target=(char *)target;
    pArgs->offsets=offsets;
}